

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O1

void __thiscall GetOpt::GetOpt_pp::_parse_sub_file(GetOpt_pp *this,string *file)

{
  istream *piVar1;
  OptionsFileNotFoundEx *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string arg;
  ifstream ifile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  value_type local_250;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,(file->_M_dataplus)._M_p,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    while( true ) {
      piVar1 = std::operator>>((istream *)local_230,(string *)&local_250);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_268,&local_250);
    }
    _parse(this,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    std::ifstream::~ifstream(local_230);
    return;
  }
  this_00 = (OptionsFileNotFoundEx *)__cxa_allocate_exception(0x28);
  OptionsFileNotFoundEx::OptionsFileNotFoundEx(this_00,file);
  __cxa_throw(this_00,&OptionsFileNotFoundEx::typeinfo,OptionsFileNotFoundEx::~OptionsFileNotFoundEx
             );
}

Assistant:

GETOPT_INLINE void GetOpt_pp::_parse_sub_file(const std::string& file)
{
    std::ifstream ifile(file.c_str());
    if (!ifile)
        throw OptionsFileNotFoundEx(file);

    std::vector<std::string> args;
    std::string arg;

    while (ifile >> arg)
        args.push_back(arg);

    _parse(args);
}